

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSimSat.c
# Opt level: O3

void Ssw_ManResimulateBit(Ssw_Man_t *p,Aig_Obj_t *pCand,Aig_Obj_t *pRepr)

{
  undefined1 *puVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  Aig_Man_t *pAVar9;
  timespec ts;
  timespec local_30;
  
  iVar3 = clock_gettime(3,&local_30);
  if (iVar3 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  puVar1 = &p->pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  pAVar9 = p->pAig;
  pVVar5 = pAVar9->vCis;
  if (0 < pVVar5->nSize) {
    uVar7 = 0;
    do {
      *(ulong *)((long)pVVar5->pArray[uVar7] + 0x18) =
           *(ulong *)((long)pVVar5->pArray[uVar7] + 0x18) & 0xffffffffffffffdf |
           (ulong)((p->pPatWords[uVar7 >> 5 & 0x7ffffff] >> ((byte)uVar7 & 0x1f) & 1) << 5);
      uVar7 = uVar7 + 1;
      pAVar9 = p->pAig;
      pVVar5 = pAVar9->vCis;
    } while ((long)uVar7 < (long)pVVar5->nSize);
  }
  pVVar5 = pAVar9->vObjs;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar6];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
             (ulong)((((uint)*(ulong *)((long)pvVar2 + 0x10) ^
                      *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 5)
                      & ((uint)*(ulong *)((long)pvVar2 + 8) ^
                        *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) >> 5)
                     & 1) << 5);
        pAVar9 = p->pAig;
      }
      lVar6 = lVar6 + 1;
      pVVar5 = pAVar9->vObjs;
    } while (lVar6 < pVVar5->nSize);
  }
  if (pRepr != (Aig_Obj_t *)0x0) {
    iVar3 = Ssw_ClassesRefineConst1(p->ppClasses,0);
    iVar4 = Ssw_ClassesRefine(p->ppClasses,0);
    if (((ulong)pRepr & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    if ((*(uint *)&pRepr->field_0x18 & 7) == 1) {
      if (iVar3 == 0) {
        __assert_fail("RetValue1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSimSat.c"
                      ,0x43,"void Ssw_ManResimulateBit(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
    }
    else if (iVar4 == 0) {
      __assert_fail("RetValue2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSimSat.c"
                    ,0x49,"void Ssw_ManResimulateBit(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  iVar3 = clock_gettime(3,&local_30);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  p->timeSimSat = p->timeSimSat + lVar6 + lVar8;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Handle the counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManResimulateBit( Ssw_Man_t * p, Aig_Obj_t * pCand, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pObj;
    int i, RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    // set the PI simulation information
    Aig_ManConst1(p->pAig)->fMarkB = 1;
    Aig_ManForEachCi( p->pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit( p->pPatWords, i );
    // simulate internal nodes
    Aig_ManForEachNode( p->pAig, pObj, i )
        pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                     & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
    // if repr is given, perform refinement
    if ( pRepr )
    {
        // check equivalence classes
        RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 0 );
        RetValue2 = Ssw_ClassesRefine( p->ppClasses, 0 );
        // make sure refinement happened
        if ( Aig_ObjIsConst1(pRepr) )
        {
            assert( RetValue1 );
            if ( RetValue1 == 0 )
                Abc_Print( 1, "\nSsw_ManResimulateBit() Error: RetValue1 does not hold.\n" );
        }
        else
        {
            assert( RetValue2 );
            if ( RetValue2 == 0 )
                Abc_Print( 1, "\nSsw_ManResimulateBit() Error: RetValue2 does not hold.\n" );
        }
    }
p->timeSimSat += Abc_Clock() - clk;
}